

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

void __thiscall cppcms::http::impl::file_buffer::temp_dir(file_buffer *this,string *tdir)

{
  undefined8 uVar1;
  string *in_RSI;
  logic_error *in_RDI;
  string *s;
  undefined1 local_31 [49];
  
  if (((ulong)in_RDI[1].super_backtrace._vptr_backtrace & 1) == 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    s = (string *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_31 + 1),"Can\'t update temporary dir for open file",(allocator *)s);
    booster::logic_error::logic_error(in_RDI,s);
    __cxa_throw(uVar1,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
  }
  std::__cxx11::string::operator=
            ((string *)
             &in_RDI[3].super_backtrace.frames_.super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_finish,in_RSI);
  return;
}

Assistant:

void temp_dir(std::string const &tdir)
	{
		if(!in_memory_)
			throw booster::logic_error("Can't update temporary dir for open file");
		temp_dir_ = tdir;
	}